

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int EVP_HPKE_KEY_private_key(EVP_HPKE_KEY *key,uint8_t *out,size_t *out_len,size_t max_out)

{
  bool bVar1;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  EVP_HPKE_KEY *key_local;
  
  bVar1 = key->kem->private_key_len <= max_out;
  if (bVar1) {
    OPENSSL_memcpy(out,key->private_key,key->kem->private_key_len);
    *out_len = key->kem->private_key_len;
  }
  else {
    ERR_put_error(6,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x2b8);
  }
  key_local._4_4_ = (uint)bVar1;
  return key_local._4_4_;
}

Assistant:

int EVP_HPKE_KEY_private_key(const EVP_HPKE_KEY *key, uint8_t *out,
                             size_t *out_len, size_t max_out) {
  if (max_out < key->kem->private_key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_BUFFER_SIZE);
    return 0;
  }
  OPENSSL_memcpy(out, key->private_key, key->kem->private_key_len);
  *out_len = key->kem->private_key_len;
  return 1;
}